

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O0

void __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::MemoryPoolAllocator
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,size_t chunkSize,
          CrtAllocator *baseAllocator)

{
  ChunkHeader *pCVar1;
  void *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  CrtAllocator *in_stack_ffffffffffffffa8;
  void *local_50;
  void *local_40;
  
  *in_RDI = in_RSI;
  local_40 = in_RDX;
  if (in_RDX == (void *)0x0) {
    local_40 = operator_new(1);
  }
  in_RDI[1] = local_40;
  if (in_RDI[1] == 0) {
    local_50 = (void *)0x0;
  }
  else {
    local_50 = CrtAllocator::Malloc(in_stack_ffffffffffffffa8,0x24205b);
  }
  in_RDI[2] = local_50;
  if (in_RDX == (void *)0x0) {
    *(undefined8 *)(in_RDI[2] + 8) = in_RDI[1];
  }
  else {
    *(undefined8 *)(in_RDI[2] + 8) = 0;
  }
  pCVar1 = GetChunkHead((SharedData *)in_RDI[2]);
  *(ChunkHeader **)in_RDI[2] = pCVar1;
  **(undefined8 **)in_RDI[2] = 0;
  *(undefined8 *)(*(long *)in_RDI[2] + 8) = 0;
  *(undefined8 *)(*(long *)in_RDI[2] + 0x10) = 0;
  *(undefined1 *)(in_RDI[2] + 0x18) = 1;
  *(undefined8 *)(in_RDI[2] + 0x10) = 1;
  return;
}

Assistant:

explicit
    MemoryPoolAllocator(size_t chunkSize = kDefaultChunkCapacity, BaseAllocator* baseAllocator = 0) : 
        chunk_capacity_(chunkSize),
        baseAllocator_(baseAllocator ? baseAllocator : RAPIDJSON_NEW(BaseAllocator)()),
        shared_(static_cast<SharedData*>(baseAllocator_ ? baseAllocator_->Malloc(SIZEOF_SHARED_DATA + SIZEOF_CHUNK_HEADER) : 0))
    {
        RAPIDJSON_ASSERT(baseAllocator_ != 0);
        RAPIDJSON_ASSERT(shared_ != 0);
        if (baseAllocator) {
            shared_->ownBaseAllocator = 0;
        }
        else {
            shared_->ownBaseAllocator = baseAllocator_;
        }
        shared_->chunkHead = GetChunkHead(shared_);
        shared_->chunkHead->capacity = 0;
        shared_->chunkHead->size = 0;
        shared_->chunkHead->next = 0;
        shared_->ownBuffer = true;
        shared_->refcount = 1;
    }